

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::TextureMinFilterCase::testTexture
          (TextureMinFilterCase *this)

{
  TexParamVerifier *pTVar1;
  int local_30;
  int local_2c;
  int ndx_1;
  int ndx;
  GLenum minValues [6];
  TextureMinFilterCase *this_local;
  
  _ndx_1 = 0x260100002600;
  minValues[0] = 0x2700;
  minValues[1] = 0x2702;
  minValues[2] = 0x2701;
  minValues[3] = 0x2703;
  pTVar1 = (this->super_TextureCase).m_verifier;
  minValues._16_8_ = this;
  (*pTVar1->_vptr_TexParamVerifier[2])
            (pTVar1,(this->super_TextureCase).super_ApiCase.super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx,(ulong)(this->super_TextureCase).m_textureTarget,0x2801
             ,0x2702);
  ApiCase::expectError((ApiCase *)this,0);
  for (local_2c = 0; local_2c < 6; local_2c = local_2c + 1) {
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_TextureCase).super_ApiCase.super_CallLogWrapper,
               (this->super_TextureCase).m_textureTarget,0x2801,(&ndx_1)[local_2c]);
    ApiCase::expectError((ApiCase *)this,0);
    pTVar1 = (this->super_TextureCase).m_verifier;
    (*pTVar1->_vptr_TexParamVerifier[2])
              (pTVar1,(this->super_TextureCase).super_ApiCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx,(ulong)(this->super_TextureCase).m_textureTarget,
               0x2801,(ulong)(uint)(&ndx_1)[local_2c]);
    ApiCase::expectError((ApiCase *)this,0);
  }
  for (local_30 = 0; local_30 < 6; local_30 = local_30 + 1) {
    glu::CallLogWrapper::glTexParameterf
              (&(this->super_TextureCase).super_ApiCase.super_CallLogWrapper,
               (this->super_TextureCase).m_textureTarget,0x2801,(float)(uint)(&ndx_1)[local_30]);
    ApiCase::expectError((ApiCase *)this,0);
    pTVar1 = (this->super_TextureCase).m_verifier;
    (*pTVar1->_vptr_TexParamVerifier[2])
              (pTVar1,(this->super_TextureCase).super_ApiCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx,(ulong)(this->super_TextureCase).m_textureTarget,
               0x2801,(ulong)(uint)(&ndx_1)[local_30]);
    ApiCase::expectError((ApiCase *)this,0);
  }
  return;
}

Assistant:

void testTexture (void)
	{
		const GLenum minValues[] = {GL_NEAREST, GL_LINEAR, GL_NEAREST_MIPMAP_NEAREST, GL_NEAREST_MIPMAP_LINEAR, GL_LINEAR_MIPMAP_NEAREST, GL_LINEAR_MIPMAP_LINEAR};

		m_verifier->verifyInteger(m_testCtx, m_textureTarget, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_LINEAR);
		expectError(GL_NO_ERROR);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(minValues); ++ndx)
		{
			glTexParameteri(m_textureTarget, GL_TEXTURE_MIN_FILTER, minValues[ndx]);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_textureTarget, GL_TEXTURE_MIN_FILTER, minValues[ndx]);
			expectError(GL_NO_ERROR);
		}

		//check unit conversions with float

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(minValues); ++ndx)
		{
			glTexParameterf(m_textureTarget, GL_TEXTURE_MIN_FILTER, (GLfloat)minValues[ndx]);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_textureTarget, GL_TEXTURE_MIN_FILTER, minValues[ndx]);
			expectError(GL_NO_ERROR);
		}
	}